

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> qclab::dense::eye<std::complex<double>>(int64_t size)

{
  complex<double> *pcVar1;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> _Var2;
  tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> extraout_RDX_01;
  int64_t in_RSI;
  SquareMatrix<std::complex<double>_> SVar3;
  complex<double> value;
  complex<double> local_48;
  long local_38;
  int64_t i;
  undefined1 local_19;
  int64_t local_18;
  int64_t size_local;
  SquareMatrix<std::complex<double>_> *mat;
  __uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
  extraout_RDX_00;
  
  local_19 = 0;
  local_18 = in_RSI;
  size_local = size;
  std::complex<double>::complex((complex<double> *)&i,0.0,0.0);
  value._M_value._8_8_ = in_RCX;
  value._M_value._0_8_ = extraout_RDX;
  SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)size,in_RSI,value);
  _Var2._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       extraout_RDX_00.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
    std::complex<double>::complex(&local_48,1.0,0.0);
    pcVar1 = SquareMatrix<std::complex<double>_>::operator()
                       ((SquareMatrix<std::complex<double>_> *)size,local_38,local_38);
    *(undefined8 *)pcVar1->_M_value = local_48._M_value._0_8_;
    *(undefined8 *)(pcVar1->_M_value + 8) = local_48._M_value._8_8_;
    _Var2._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  }
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = size;
  return SVar3;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }